

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

string * util::fs::get_cwd_string_abi_cxx11_(void)

{
  char *__buf;
  char *pcVar1;
  Exception *this;
  string *in_RDI;
  ulong __size;
  string local_48;
  allocator local_21;
  
  __size = 0x100;
  do {
    __buf = (char *)operator_new__(__size);
    pcVar1 = getcwd(__buf,__size);
    if (pcVar1 == __buf) {
      std::__cxx11::string::string((string *)in_RDI,__buf,(allocator *)&local_48);
      operator_delete__(__buf);
      return in_RDI;
    }
    operator_delete__(__buf);
    __size = __size * 2;
  } while (__size < 0x8001);
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_48,"Error storing CWD",&local_21);
  Exception::Exception(this,&local_48);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::string
get_cwd_string (void)
{
    std::size_t size = 1 << 8;
    while (true)
    {
        char* buf = new char[size];
        if (get_cwd(buf, size) == buf)
        {
            std::string ret(buf);
            delete[] buf;
            return ret;
        }
        delete[] buf;
        size = size << 1;
        if (size > (1 << 15))
            throw Exception("Error storing CWD");
    }
}